

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformGridMediumProvider *p,Bounds3<float> *args,
          optional<pbrt::SampledGrid<float>_> *args_1,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *args_2,RGBColorSpace **args_3,
          SpectrumHandle *args_4,SampledGrid<float> *args_5,polymorphic_allocator<std::byte> *args_6
          )

{
  RGBColorSpace *colorSpace;
  SampledGrid<float> Legrid;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  TVar1;
  undefined1 in_stack_ffffffffffffff40 [24];
  undefined8 in_stack_ffffffffffffff58;
  optional<pbrt::SampledGrid<float>_> local_88;
  SampledGrid<float> local_50;
  
  optional<pbrt::SampledGrid<float>_>::optional(&local_88,args_1);
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional
            ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)&stack0xffffffffffffff40,
             args_2);
  colorSpace = *args_3;
  TVar1.bits = (args_4->
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               ).bits;
  pbrt::SampledGrid<float>::SampledGrid(&local_50,args_5);
  Legrid.values.ptr = (float *)args_6->memoryResource;
  Legrid.values.alloc.memoryResource = (memory_resource *)&local_50;
  Legrid.values.nAlloc = TVar1.bits;
  Legrid.values.nStored = in_stack_ffffffffffffff40._0_8_;
  Legrid.nx = in_stack_ffffffffffffff40._8_4_;
  Legrid.ny = in_stack_ffffffffffffff40._12_4_;
  Legrid.nz = in_stack_ffffffffffffff40._16_4_;
  Legrid._44_4_ = in_stack_ffffffffffffff40._20_4_;
  pbrt::UniformGridMediumProvider::UniformGridMediumProvider
            (p,args,&local_88,
             (optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)&stack0xffffffffffffff40,
             colorSpace,(SpectrumHandle *)&stack0xffffffffffffff38,Legrid,
             (Allocator)in_stack_ffffffffffffff58);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_50.values);
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::~optional
            ((optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *)&stack0xffffffffffffff40);
  optional<pbrt::SampledGrid<float>_>::~optional(&local_88);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }